

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O2

Availability __thiscall
anon_unknown.dwarf_9a1342::Satisfier::Sign
          (Satisfier *this,CPubKey *key,vector<unsigned_char,_std::allocator<unsigned_char>_> *sig)

{
  bool bVar1;
  size_type sVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  _Base_ptr __x;
  Availability AVar5;
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *this_00;
  long in_FS_OFFSET;
  XOnlyPubKey local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.m_keydata.super_base_blob<256U>.m_data._M_elems._4_4_ = *(undefined4 *)(key->vch + 0x1d);
  local_50.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\x06';
  local_50.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_50.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_50.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  sVar2 = std::
          set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
          ::count(&this->supported,(key_type *)&local_50);
  AVar5 = NO;
  if (sVar2 != 0) {
    bVar1 = miniscript::IsTapscript((this->super_KeyConverter).m_script_ctx);
    if (bVar1) {
      this_00 = (_Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)((anonymous_namespace)::g_testdata + 0xd8);
      XOnlyPubKey::XOnlyPubKey(&local_50,key);
      cVar3 = std::
              _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::find(this_00,&local_50);
      if (cVar3._M_node == (_Base_ptr)((anonymous_namespace)::g_testdata + 0xe0)) goto LAB_003bee2d;
      __x = cVar3._M_node + 2;
    }
    else {
      cVar4 = std::
              _Rb_tree<CPubKey,_std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::find((_Rb_tree<CPubKey,_std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)((anonymous_namespace)::g_testdata + 0xa8),key);
      AVar5 = NO;
      if (cVar4._M_node == (_Base_ptr)((anonymous_namespace)::g_testdata + 0xb0)) goto LAB_003bee2d;
      __x = (_Base_ptr)&cVar4._M_node[3]._M_parent;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (sig,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
    AVar5 = YES;
  }
LAB_003bee2d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return AVar5;
  }
  __stack_chk_fail();
}

Assistant:

miniscript::Availability Sign(const CPubKey& key, std::vector<unsigned char>& sig) const {
        if (supported.count(Challenge(ChallengeType::PK, ChallengeNumber(key)))) {
            if (!miniscript::IsTapscript(m_script_ctx)) {
                auto it = g_testdata->signatures.find(key);
                if (it == g_testdata->signatures.end()) return miniscript::Availability::NO;
                sig = it->second;
            } else {
                auto it = g_testdata->schnorr_signatures.find(XOnlyPubKey{key});
                if (it == g_testdata->schnorr_signatures.end()) return miniscript::Availability::NO;
                sig = it->second;
            }
            return miniscript::Availability::YES;
        }
        return miniscript::Availability::NO;
    }